

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> * __thiscall
cfd::core::ByteData::SplitData
          (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__return_storage_ptr__
          ,ByteData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *split_size_list)

{
  int iVar1;
  int iVar2;
  pointer puVar3;
  CfdException *this_00;
  uint uVar4;
  pointer puVar5;
  allocator local_5d;
  uint32_t size;
  vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *local_58;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = *(int *)&(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  puVar5 = (split_size_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (split_size_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  local_58 = (vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>> *)
             __return_storage_ptr__;
  do {
    if (puVar5 == puVar3) {
      return (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_58;
    }
    size = *puVar5;
    if (size == 0) {
      ByteData((ByteData *)&local_50);
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_58,
                 (ByteData *)&local_50);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
    }
    else {
      if ((uint)(iVar1 - iVar2) < size + uVar4) {
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string((string *)&local_50,"total size is maximum over.",&local_5d);
        CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_50);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_50._M_dataplus._M_p =
           (pointer)((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar4);
      ::std::vector<cfd::core::ByteData,std::allocator<cfd::core::ByteData>>::
      emplace_back<unsigned_char_const*,unsigned_int&>(local_58,(uchar **)&local_50,&size);
      uVar4 = uVar4 + size;
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

std::vector<ByteData> ByteData::SplitData(
    const std::vector<uint32_t>& split_size_list) const {
  std::vector<ByteData> result;
  uint32_t offset = 0;
  uint32_t max = static_cast<uint32_t>(data_.size());
  for (uint32_t size : split_size_list) {
    if (size == 0) {
      result.emplace_back(ByteData());
    } else if ((offset + size) > max) {
      throw CfdException(
          kCfdIllegalArgumentError, "total size is maximum over.");
    } else {
      result.emplace_back(&data_[offset], size);
      offset += size;
    }
  }
  return result;
}